

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

int json_value_equals(JSON_Value *a,JSON_Value *b)

{
  double dVar1;
  double dVar2;
  JSON_Value_Type JVar3;
  JSON_Value_Type JVar4;
  int iVar5;
  int iVar6;
  JSON_Array *array;
  JSON_Array *array_00;
  size_t sVar7;
  size_t sVar8;
  JSON_Value *pJVar9;
  JSON_Value *pJVar10;
  JSON_Object *object;
  JSON_Object *object_00;
  char *name;
  JSON_String *pJVar11;
  JSON_String *pJVar12;
  bool local_91;
  JSON_Value_Type b_type;
  JSON_Value_Type a_type;
  size_t i;
  size_t b_count;
  size_t a_count;
  char *key;
  JSON_String *b_string;
  JSON_String *a_string;
  JSON_Array *b_array;
  JSON_Array *a_array;
  JSON_Object *b_object;
  JSON_Object *a_object;
  JSON_Value *b_local;
  JSON_Value *a_local;
  
  JVar3 = json_value_get_type(a);
  JVar4 = json_value_get_type(b);
  if (JVar3 == JVar4) {
    switch(JVar3) {
    default:
      a_local._4_4_ = 1;
      break;
    case 1:
      a_local._4_4_ = 1;
      break;
    case 2:
      pJVar11 = json_value_get_string_desc(a);
      pJVar12 = json_value_get_string_desc(b);
      if ((pJVar11 == (JSON_String *)0x0) || (pJVar12 == (JSON_String *)0x0)) {
        a_local._4_4_ = 0;
      }
      else {
        local_91 = false;
        if (pJVar11->length == pJVar12->length) {
          iVar5 = memcmp(pJVar11->chars,pJVar12->chars,pJVar11->length);
          local_91 = iVar5 == 0;
        }
        a_local._4_4_ = (uint)local_91;
      }
      break;
    case 3:
      dVar1 = json_value_get_number(a);
      dVar2 = json_value_get_number(b);
      a_local._4_4_ = (uint)(ABS(dVar1 - dVar2) < 1e-06);
      break;
    case 4:
      object = json_value_get_object(a);
      object_00 = json_value_get_object(b);
      sVar7 = json_object_get_count(object);
      sVar8 = json_object_get_count(object_00);
      if (sVar7 == sVar8) {
        for (_b_type = 0; _b_type < sVar7; _b_type = _b_type + 1) {
          name = json_object_get_name(object,_b_type);
          pJVar9 = json_object_get_value(object,name);
          pJVar10 = json_object_get_value(object_00,name);
          iVar5 = json_value_equals(pJVar9,pJVar10);
          if (iVar5 == 0) {
            return 0;
          }
        }
        a_local._4_4_ = 1;
      }
      else {
        a_local._4_4_ = 0;
      }
      break;
    case 5:
      array = json_value_get_array(a);
      array_00 = json_value_get_array(b);
      sVar7 = json_array_get_count(array);
      sVar8 = json_array_get_count(array_00);
      if (sVar7 == sVar8) {
        for (_b_type = 0; _b_type < sVar7; _b_type = _b_type + 1) {
          pJVar9 = json_array_get_value(array,_b_type);
          pJVar10 = json_array_get_value(array_00,_b_type);
          iVar5 = json_value_equals(pJVar9,pJVar10);
          if (iVar5 == 0) {
            return 0;
          }
        }
        a_local._4_4_ = 1;
      }
      else {
        a_local._4_4_ = 0;
      }
      break;
    case 6:
      iVar5 = json_value_get_boolean(a);
      iVar6 = json_value_get_boolean(b);
      a_local._4_4_ = (uint)(iVar5 == iVar6);
      break;
    case -1:
      a_local._4_4_ = 1;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int json_value_equals(const JSON_Value *a, const JSON_Value *b) {
    JSON_Object *a_object = NULL, *b_object = NULL;
    JSON_Array *a_array = NULL, *b_array = NULL;
    const JSON_String *a_string = NULL, *b_string = NULL;
    const char *key = NULL;
    size_t a_count = 0, b_count = 0, i = 0;
    JSON_Value_Type a_type, b_type;
    a_type = json_value_get_type(a);
    b_type = json_value_get_type(b);
    if (a_type != b_type) {
        return PARSON_FALSE;
    }
    switch (a_type) {
        case JSONArray:
            a_array = json_value_get_array(a);
            b_array = json_value_get_array(b);
            a_count = json_array_get_count(a_array);
            b_count = json_array_get_count(b_array);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                if (!json_value_equals(json_array_get_value(a_array, i),
                                       json_array_get_value(b_array, i))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONObject:
            a_object = json_value_get_object(a);
            b_object = json_value_get_object(b);
            a_count = json_object_get_count(a_object);
            b_count = json_object_get_count(b_object);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                key = json_object_get_name(a_object, i);
                if (!json_value_equals(json_object_get_value(a_object, key),
                                       json_object_get_value(b_object, key))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONString:
            a_string = json_value_get_string_desc(a);
            b_string = json_value_get_string_desc(b);
            if (a_string == NULL || b_string == NULL) {
                return PARSON_FALSE; /* shouldn't happen */
            }
            return a_string->length == b_string->length &&
                   memcmp(a_string->chars, b_string->chars, a_string->length) == 0;
        case JSONBoolean:
            return json_value_get_boolean(a) == json_value_get_boolean(b);
        case JSONNumber:
            return fabs(json_value_get_number(a) - json_value_get_number(b)) < 0.000001; /* EPSILON */
        case JSONError:
            return PARSON_TRUE;
        case JSONNull:
            return PARSON_TRUE;
        default:
            return PARSON_TRUE;
    }
}